

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

int __thiscall Node::OutputOngo(Node *this,ostream *os,char *OnType,int GoLevel)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  void *this_00;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [48];
  undefined1 local_48 [40];
  int flag;
  int GoLevel_local;
  char *OnType_local;
  ostream *os_local;
  Node *this_local;
  
  local_48._32_4_ = 0;
  local_48._36_4_ = GoLevel;
  _flag = (Node *)OnType;
  OnType_local = (char *)os;
  os_local = (ostream *)this;
  if (this->Type == 0x1d2) {
    Indent_abi_cxx11_((Node *)local_48);
    poVar3 = std::operator<<(os,(string *)local_48);
    poVar3 = std::operator<<(poVar3,"case ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_48._36_4_);
    poVar3 = std::operator<<(poVar3,":");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
    pcVar1 = OnType_local;
    Level = Level + 1;
    Indent_abi_cxx11_((Node *)local_78);
    poVar3 = std::operator<<((ostream *)pcVar1,(string *)local_78);
    std::operator<<(poVar3,(char *)_flag);
    std::__cxx11::string::~string((string *)local_78);
    iVar2 = strcmp((char *)_flag,"goto");
    if (iVar2 == 0) {
      poVar3 = std::operator<<((ostream *)OnType_local,' ');
      OutputLabel_abi_cxx11_((Node *)local_98);
      poVar3 = std::operator<<(poVar3,(string *)local_98);
      poVar3 = std::operator<<(poVar3,";");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_98);
    }
    else {
      poVar3 = std::operator<<((ostream *)OnType_local,'(');
      OutputLabel_abi_cxx11_((Node *)local_b8);
      poVar3 = std::operator<<(poVar3,(string *)local_b8);
      poVar3 = std::operator<<(poVar3,");");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_b8);
      pcVar1 = OnType_local;
      Indent_abi_cxx11_((Node *)local_d8);
      poVar3 = std::operator<<((ostream *)pcVar1,(string *)local_d8);
      poVar3 = std::operator<<(poVar3,"break;");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_d8);
    }
    Level = Level + -1;
  }
  else if (this->Type == 0x1f5) {
    local_48._32_4_ = OutputOngo(this->Tree[0],os,OnType,GoLevel);
    iVar2 = OutputOngo(this->Tree[1],(ostream *)OnType_local,(char *)_flag,local_48._36_4_ + 1);
    local_48._32_4_ = iVar2 + local_48._32_4_;
  }
  else {
    poVar3 = std::operator<<(os,"Error in computed ");
    poVar3 = std::operator<<(poVar3,(char *)_flag);
    poVar3 = std::operator<<(poVar3," (");
    Expression_abi_cxx11_((Node *)local_f8);
    poVar3 = std::operator<<(poVar3,(string *)local_f8);
    poVar3 = std::operator<<(poVar3,") @ ");
    this_00 = (void *)std::ostream::operator<<(poVar3,this->lineno);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_f8);
  }
  return local_48._32_4_;
}

Assistant:

int Node::OutputOngo(
	std::ostream& os,	/**< iostream to write C++ code to */
	const char* OnType,	/**< data type */
	int GoLevel		/**< goto level */
)
{
	int flag = 0;

	switch(Type)
	{
	case BAS_N_LIST:
		flag = Tree[0]->OutputOngo(os, OnType, GoLevel);
		flag += Tree[1]->OutputOngo(os, OnType, GoLevel + 1);
		break;

	case BAS_V_USELABEL:
		os << Indent() << "case " << GoLevel << ":" << std::endl;
		Level++;
		os << Indent() << OnType;
		if (strcmp(OnType, "goto") == 0)
		{
			os << ' ' << OutputLabel() << ";" << std::endl;
			// goto doesn't need to be followed by a break
		}
		else
		{
			os << '(' << OutputLabel() << ");" << std::endl;
			os << Indent() << "break;" << std::endl;
		}
		Level--;
		break;

	default:
		os << "Error in computed " << OnType <<
			" (" << Expression() << ") @ " << lineno << std::endl;
		break;
	}
	return flag;
}